

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::Expression,duckdb::BoundReferenceExpression,duckdb::LogicalTypeId_const&,unsigned_int>
          (duckdb *this,LogicalTypeId *args,uint *args_1)

{
  BoundReferenceExpression *pBVar1;
  LogicalType aLStack_38 [24];
  
  pBVar1 = (BoundReferenceExpression *)operator_new(0x60);
  duckdb::LogicalType::LogicalType(aLStack_38,*args);
  duckdb::BoundReferenceExpression::BoundReferenceExpression(pBVar1,aLStack_38,*args_1);
  *(BoundReferenceExpression **)this = pBVar1;
  duckdb::LogicalType::~LogicalType(aLStack_38);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}